

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

void __thiscall
FBlockLinesIterator::FBlockLinesIterator
          (FBlockLinesIterator *this,int _minx,int _miny,int _maxx,int _maxy,bool keepvalidcount)

{
  bool keepvalidcount_local;
  int _maxy_local;
  int _maxx_local;
  int _miny_local;
  int _minx_local;
  FBlockLinesIterator *this_local;
  
  if (!keepvalidcount) {
    validcount = validcount + 1;
  }
  this->minx = _minx;
  this->maxx = _maxx;
  this->miny = _miny;
  this->maxy = _maxy;
  Reset(this);
  return;
}

Assistant:

FBlockLinesIterator::FBlockLinesIterator(int _minx, int _miny, int _maxx, int _maxy, bool keepvalidcount)
{
	if (!keepvalidcount) validcount++;
	minx = _minx;
	maxx = _maxx;
	miny = _miny;
	maxy = _maxy;
	Reset();
}